

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
FxGlobalVariable::FxGlobalVariable(FxGlobalVariable *this,PField *mem,FScriptPosition *pos)

{
  FScriptPosition *pos_local;
  PField *mem_local;
  FxGlobalVariable *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_GlobalVariable,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxGlobalVariable_00a0ae70;
  this->membervar = mem;
  this->AddressRequested = false;
  this->AddressWritable = true;
  return;
}

Assistant:

FxGlobalVariable::FxGlobalVariable(PField* mem, const FScriptPosition &pos)
	: FxExpression(EFX_GlobalVariable, pos)
{
	membervar = mem;
	AddressRequested = false;
	AddressWritable = true;	// must be true unless classx tells us otherwise if requested.
}